

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscrete.cpp
# Opt level: O1

void __thiscall
MultiAgentDecisionProcessDiscrete::SoftPrint_abi_cxx11_(MultiAgentDecisionProcessDiscrete *this)

{
  long *in_RSI;
  
  SoftPrint_abi_cxx11_
            ((string *)this,
             (MultiAgentDecisionProcessDiscrete *)((long)in_RSI + *(long *)(*in_RSI + -0x180)));
  return;
}

Assistant:

string MultiAgentDecisionProcessDiscrete::SoftPrint() const
{
    stringstream ss;

    ss << MultiAgentDecisionProcess::SoftPrint();
    ss << _m_S.SoftPrint();
    ss << _m_A.SoftPrint();
    ss << _m_O.SoftPrint();   
   
    if(_m_initialized)
    {
        ss << "Transition model: " << endl;
        ss << _m_p_tModel->SoftPrint();
        ss << "Observation model: " << endl;
        ss << _m_p_oModel->SoftPrint();
    }
    return(ss.str());
}